

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double __thiscall CEDate::GetSecondsSinceMidnight(CEDate *this,double *utc_offset)

{
  double *in_RSI;
  long *in_RDI;
  double dVar1;
  double mjd_offset;
  
  dVar1 = (double)(**(code **)(*in_RDI + 0x28))();
  floor(dVar1);
  dVar1 = CETime::UTC(in_RSI);
  return dVar1;
}

Assistant:

double CEDate::GetSecondsSinceMidnight(const double& utc_offset)
{
    double mjd_offset = MJD();
    mjd_offset -= std::floor(mjd_offset);
    mjd_offset += utc_offset/24.0;
    return CETime::UTC( mjd_offset ) ;
}